

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleBot.h
# Opt level: O0

void __thiscall ExampleBot::ExampleBot(ExampleBot *this,string *name)

{
  string local_38 [32];
  string *local_18;
  string *name_local;
  ExampleBot *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string(local_38,(string *)name);
  Player::Player(&this->super_Player,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  (this->super_Player)._vptr_Player = (_func_int **)&PTR_nextRound_00127d70;
  return;
}

Assistant:

ExampleBot(std::string name = "noName") : Player(name) {}